

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void write_bmp_header(j_decompress_ptr cinfo,bmp_dest_ptr dest)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  long in_RSI;
  long *in_RDI;
  int cmap_entries;
  int bits_per_pixel;
  long bfSize;
  long headersize;
  char bmpinfoheader [40];
  char bmpfileheader [14];
  int local_60;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined2 in_stack_ffffffffffffffba;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  long local_10;
  long *local_8;
  
  if (((int)in_RDI[8] == 2) || ((5 < *(uint *)(in_RDI + 8) && (*(uint *)(in_RDI + 8) < 0x10)))) {
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      uVar16 = 0x18;
      local_60 = 0;
    }
    else {
      uVar16 = 8;
      local_60 = 0x100;
    }
  }
  else if (((int)in_RDI[8] == 0x10) || ((int)in_RDI[8] == 4)) {
    uVar16 = 0x18;
    local_60 = 0;
  }
  else {
    uVar16 = 8;
    local_60 = 0x100;
  }
  lVar9 = (long)(local_60 * 4 + 0x36);
  lVar10 = lVar9 + (ulong)*(uint *)(in_RSI + 0x4c) * (ulong)*(uint *)((long)in_RDI + 0x8c);
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_1e,0,0xe);
  memset(&stack0xffffffffffffffb8,0,0x28);
  local_1e = 0x42;
  local_1d = 0x4d;
  local_1c = (undefined1)lVar10;
  local_1b = (undefined1)((ulong)lVar10 >> 8);
  local_1a = (undefined1)((ulong)lVar10 >> 0x10);
  local_19 = (undefined1)((ulong)lVar10 >> 0x18);
  local_14 = (undefined1)lVar9;
  local_13 = (undefined1)((ulong)lVar9 >> 8);
  local_12 = (undefined1)((ulong)lVar9 >> 0x10);
  local_11 = (undefined1)((ulong)lVar9 >> 0x18);
  uVar12 = 0x28;
  uVar13 = 0;
  uVar1 = (undefined1)(int)local_8[0x11];
  uVar2 = (undefined1)((uint)(int)local_8[0x11] >> 8);
  uVar3 = (undefined1)((uint)(int)local_8[0x11] >> 0x10);
  uVar4 = (undefined1)((uint)(int)local_8[0x11] >> 0x18);
  uVar5 = (undefined1)*(undefined4 *)((long)local_8 + 0x8c);
  uVar6 = (undefined1)((uint)*(undefined4 *)((long)local_8 + 0x8c) >> 8);
  uVar7 = (undefined1)((uint)*(undefined4 *)((long)local_8 + 0x8c) >> 0x10);
  uVar8 = (undefined1)((uint)*(undefined4 *)((long)local_8 + 0x8c) >> 0x18);
  uVar14 = 1;
  uVar15 = 0;
  uVar17 = 0;
  sVar11 = fwrite(&local_1e,1,0xe,*(FILE **)(local_10 + 0x20));
  if (sVar11 != 0xe) {
    *(undefined4 *)(*local_8 + 0x28) = 0x25;
    (**(code **)*local_8)(local_8);
  }
  sVar11 = fwrite(&stack0xffffffffffffffb8,1,0x28,*(FILE **)(local_10 + 0x20));
  if (sVar11 != 0x28) {
    *(undefined4 *)(*local_8 + 0x28) = 0x25;
    (**(code **)*local_8)(local_8);
  }
  if (local_60 != 0) {
    write_colormap((j_decompress_ptr)
                   CONCAT17(uVar17,CONCAT16(uVar16,CONCAT15(uVar15,CONCAT14(uVar14,CONCAT13(uVar8,
                                                  CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))))),
                   (bmp_dest_ptr)
                   CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(uVar1,CONCAT22(
                                                  in_stack_ffffffffffffffba,CONCAT11(uVar13,uVar12))
                                                  )))),(int)((ulong)lVar9 >> 0x20),(int)lVar9);
  }
  return;
}

Assistant:

LOCAL(void)
write_bmp_header(j_decompress_ptr cinfo, bmp_dest_ptr dest)
/* Write a Windows-style BMP file header, including colormap if needed */
{
  char bmpfileheader[14];
  char bmpinfoheader[40];

#define PUT_2B(array, offset, value) \
  (array[offset] = (char)((value) & 0xFF), \
   array[offset + 1] = (char)(((value) >> 8) & 0xFF))
#define PUT_4B(array, offset, value) \
  (array[offset] = (char)((value) & 0xFF), \
   array[offset + 1] = (char)(((value) >> 8) & 0xFF), \
   array[offset + 2] = (char)(((value) >> 16) & 0xFF), \
   array[offset + 3] = (char)(((value) >> 24) & 0xFF))

  long headersize, bfSize;
  int bits_per_pixel, cmap_entries;

  /* Compute colormap size and total file size */
  if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors) {
      /* Colormapped RGB */
      bits_per_pixel = 8;
      cmap_entries = 256;
    } else {
      /* Unquantized, full color RGB */
      bits_per_pixel = 24;
      cmap_entries = 0;
    }
  } else if (cinfo->out_color_space == JCS_RGB565 ||
             cinfo->out_color_space == JCS_CMYK) {
    bits_per_pixel = 24;
    cmap_entries   = 0;
  } else {
    /* Grayscale output.  We need to fake a 256-entry colormap. */
    bits_per_pixel = 8;
    cmap_entries = 256;
  }
  /* File size */
  headersize = 14 + 40 + cmap_entries * 4; /* Header and colormap */
  bfSize = headersize + (long)dest->row_width * (long)cinfo->output_height;

  /* Set unused fields of header to 0 */
  MEMZERO(bmpfileheader, sizeof(bmpfileheader));
  MEMZERO(bmpinfoheader, sizeof(bmpinfoheader));

  /* Fill the file header */
  bmpfileheader[0] = 0x42;      /* first 2 bytes are ASCII 'B', 'M' */
  bmpfileheader[1] = 0x4D;
  PUT_4B(bmpfileheader, 2, bfSize); /* bfSize */
  /* we leave bfReserved1 & bfReserved2 = 0 */
  PUT_4B(bmpfileheader, 10, headersize); /* bfOffBits */

  /* Fill the info header (Microsoft calls this a BITMAPINFOHEADER) */
  PUT_2B(bmpinfoheader, 0, 40); /* biSize */
  PUT_4B(bmpinfoheader, 4, cinfo->output_width); /* biWidth */
  PUT_4B(bmpinfoheader, 8, cinfo->output_height); /* biHeight */
  PUT_2B(bmpinfoheader, 12, 1); /* biPlanes - must be 1 */
  PUT_2B(bmpinfoheader, 14, bits_per_pixel); /* biBitCount */
  /* we leave biCompression = 0, for none */
  /* we leave biSizeImage = 0; this is correct for uncompressed data */
  if (cinfo->density_unit == 2) { /* if have density in dots/cm, then */
    PUT_4B(bmpinfoheader, 24, (long)(cinfo->X_density * 100)); /* XPels/M */
    PUT_4B(bmpinfoheader, 28, (long)(cinfo->Y_density * 100)); /* XPels/M */
  }
  PUT_2B(bmpinfoheader, 32, cmap_entries); /* biClrUsed */
  /* we leave biClrImportant = 0 */

  if (JFWRITE(dest->pub.output_file, bmpfileheader, 14) != (size_t)14)
    ERREXIT(cinfo, JERR_FILE_WRITE);
  if (JFWRITE(dest->pub.output_file, bmpinfoheader, 40) != (size_t)40)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  if (cmap_entries > 0)
    write_colormap(cinfo, dest, cmap_entries, 4);
}